

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::execute
          (SubmitCommandBuffer *this,ExecuteContext *context)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer cmd;
  VkSubmitInfo submit;
  
  pDVar1 = context->m_context->m_vkd;
  cmd = (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  submit.pCommandBuffers = &cmd;
  submit.pNext = (void *)0x0;
  submit.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submit.signalSemaphoreCount = 0;
  submit._60_4_ = 0;
  submit.waitSemaphoreCount = 0;
  submit._20_4_ = 0;
  submit.pWaitSemaphores = (VkSemaphore *)0x0;
  submit.pSignalSemaphores = (VkSemaphore *)0x0;
  submit.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submit._4_4_ = 0;
  submit.commandBufferCount = 1;
  submit._44_4_ = 0;
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,context->m_context->m_queue,1,&submit,0);
  return;
}

Assistant:

void SubmitCommandBuffer::execute (ExecuteContext& context)
{
	const vk::DeviceInterface&	vkd		= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	cmd		= *m_commandBuffer;
	const vk::VkQueue			queue	= context.getContext().getQueue();
	const vk::VkSubmitInfo		submit	=
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,

		0,
		DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,

		1,
		&cmd,

		0,
		DE_NULL
	};

	vkd.queueSubmit(queue, 1, &submit, 0);
}